

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegistryAccess.cpp
# Opt level: O0

void bhf::ads::ParseDwordData(RegistryEntry *value,char **it,istream *param_3,size_t *lineNumber)

{
  unsigned_long uVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  string local_520 [32];
  stringstream local_500 [8];
  stringstream ss_1;
  ostream local_4f0 [376];
  long local_378;
  unsigned_long i;
  stringstream converter;
  undefined1 local_360 [376];
  uint local_1e8;
  undefined1 local_1e1;
  uint32_t v;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [376];
  ulong *local_28;
  size_t *lineNumber_local;
  istream *param_2_local;
  char **it_local;
  RegistryEntry *value_local;
  
  local_28 = lineNumber;
  lineNumber_local = (size_t *)param_3;
  param_2_local = (istream *)it;
  it_local = (char **)value;
  if (**it == '\0') {
    std::__cxx11::stringstream::stringstream(local_1b0);
    uVar1 = std::numeric_limits<unsigned_long>::max();
    if (uVar1 == *local_28) {
      poVar2 = std::operator<<(local_1a0,"Invalid network data: ");
      poVar2 = std::operator<<(poVar2,"invalid dword hex character length (no data)");
      std::operator<<(poVar2,'\n');
    }
    else {
      poVar2 = std::operator<<(local_1a0,"Invalid file format: ");
      poVar2 = std::operator<<(poVar2,"invalid dword hex character length (no data)");
      poVar2 = std::operator<<(poVar2," in line ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*local_28);
      std::operator<<(poVar2,'\n');
    }
    local_1e1 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar3,(string *)&v);
    local_1e1 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1e8 = 0;
  std::__cxx11::stringstream::stringstream((stringstream *)&i);
  local_378 = 8;
  while ((local_378 != 0 && (**(char **)param_2_local != '\0'))) {
    poVar2 = (ostream *)std::ostream::operator<<(local_360,std::hex);
    std::operator<<(poVar2,**(char **)param_2_local);
    local_378 = local_378 + -1;
    *(long *)param_2_local = *(long *)param_2_local + 1;
  }
  if (**(char **)param_2_local == '\0') {
    std::istream::operator>>(&i,&local_1e8);
    RegistryEntry::PushData<unsigned_int>((RegistryEntry *)it_local,local_1e8);
    std::__cxx11::stringstream::~stringstream((stringstream *)&i);
    return;
  }
  std::__cxx11::stringstream::stringstream(local_500);
  uVar1 = std::numeric_limits<unsigned_long>::max();
  if (uVar1 == *local_28) {
    poVar2 = std::operator<<(local_4f0,"Invalid network data: ");
    poVar2 = std::operator<<(poVar2,"invalid dword hex character length (too long)");
    std::operator<<(poVar2,'\n');
  }
  else {
    poVar2 = std::operator<<(local_4f0,"Invalid file format: ");
    poVar2 = std::operator<<(poVar2,"invalid dword hex character length (too long)");
    poVar2 = std::operator<<(poVar2," in line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*local_28);
    std::operator<<(poVar2,'\n');
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  std::runtime_error::runtime_error(prVar3,local_520);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void ParseDwordData(bhf::ads::RegistryEntry& value, const char*& it, std::istream& /*input*/, size_t& lineNumber)
{
    if ('\0' == *it) {
        PARSING_EXCEPTION("invalid dword hex character length (no data)");
    }

    uint32_t v = 0;
    std::stringstream converter;
    for (auto i = 2 * sizeof(v); i; --i, ++it) {
        if ('\0' == *it) {
            break;
        }
        converter << std::hex << *it;
    }
    if ('\0' != *it) {
        PARSING_EXCEPTION("invalid dword hex character length (too long)");
    }

    converter >> v;
    value.PushData(v);
}